

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Expression * __thiscall slang::ast::Compilation::getDefaultDisable(Compilation *this,Scope *scope)

{
  group15<boost::unordered::detail::foa::plain_integral> *pgVar1;
  bool bVar2;
  long lVar3;
  raw_key_type *__y;
  pointer ppVar4;
  Symbol *pSVar5;
  Scope *in_RSI;
  long in_RDI;
  const_iterator it;
  Scope *curr;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_fffffffffffffe88;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  *in_stack_fffffffffffffe90;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffe98;
  Scope *local_120 [4];
  group15<boost::unordered::detail::foa::plain_integral> *local_100;
  long local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  group15<boost::unordered::detail::foa::plain_integral> *local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
  local_b0;
  group15<boost::unordered::detail::foa::plain_integral> *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  group15<boost::unordered::detail::foa::plain_integral> *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  group15<boost::unordered::detail::foa::plain_integral> *local_10;
  long local_8;
  
  local_120[0] = in_RSI;
  do {
    lVar3 = in_RDI + 0xab0;
    local_100 = (group15<boost::unordered::detail::foa::plain_integral> *)local_120;
    local_f8 = lVar3;
    local_d0 = local_100;
    local_c8 = lVar3;
    local_98 = local_100;
    local_90 = lVar3;
    local_70 = local_100;
    local_68 = lVar3;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
               ::hash_for<slang::ast::Scope_const*>
                         (in_stack_fffffffffffffe90,(Scope **)in_stack_fffffffffffffe88);
    pgVar1 = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
               ::position_for(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    local_10 = pgVar1;
    local_20 = local_78;
    local_8 = lVar3;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                           *)0x34ce66);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           (in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                               *)0x34ceb1);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffe90 =
               (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                          *)0x34cf01);
          in_stack_fffffffffffffe98 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>>
                ::key_from<std::pair<slang::ast::Scope_const*const,slang::ast::Expression_const*>>
                          ((pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*> *)
                           0x34cf2e);
          bVar2 = std::equal_to<const_slang::ast::Scope_*>::operator()
                            ((equal_to<const_slang::ast::Scope_*> *)in_stack_fffffffffffffe90,
                             (Scope **)in_stack_fffffffffffffe98,__y);
          if (bVar2) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0034d022;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      if (bVar2) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
        ::table_locator(&local_b0);
        goto LAB_0034d022;
      }
      bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(in_RDI + 0xab8));
    } while (bVar2);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>
    ::table_locator(&local_b0);
LAB_0034d022:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
               ::make_iterator((locator *)0x34d02f);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = local_c0.pc_;
    local_e8 = local_c0.p_;
    boost::unordered::
    unordered_flat_map<const_slang::ast::Scope_*,_const_slang::ast::Expression_*,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
    ::end((unordered_flat_map<const_slang::ast::Scope_*,_const_slang::ast::Expression_*,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           *)0x34d0bf);
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (bVar2) {
      ppVar4 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)0x34d0e8);
      return ppVar4->second;
    }
    pSVar5 = Scope::asSymbol(local_120[0]);
    local_120[0] = Symbol::getParentScope(pSVar5);
    if ((local_120[0] == (Scope *)0x0) ||
       (pSVar5 = Scope::asSymbol(local_120[0]), pSVar5->kind == CompilationUnit)) {
      return (Expression *)0x0;
    }
  } while( true );
}

Assistant:

const Expression* Compilation::getDefaultDisable(const Scope& scope) const {
    auto curr = &scope;
    while (true) {
        if (auto it = defaultDisableMap.find(curr); it != defaultDisableMap.end())
            return it->second;

        curr = curr->asSymbol().getParentScope();
        if (!curr || curr->asSymbol().kind == SymbolKind::CompilationUnit)
            return nullptr;
    }
}